

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateFixedArgs
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  pointer pTVar1;
  const_iterator cVar2;
  value_type *__x;
  long lVar3;
  size_t i;
  ulong uVar4;
  int position;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_48;
  ConfigData *local_40;
  map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  position = 1;
  local_38 = &this->m_positionalArgs;
  lVar3 = 0;
  uVar4 = 0;
  local_48 = __return_storage_ptr__;
  local_40 = config;
  while( true ) {
    pTVar1 = (tokens->
             super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(tokens->
                       super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x28) <= uVar4)
    break;
    cVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>,_std::_Select1st<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
            ::find(&local_38->_M_t,&position);
    __x = (value_type *)((long)&pTVar1->type + lVar3);
    if ((_Rb_tree_header *)cVar2._M_node ==
        &(this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header) {
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      push_back(local_48,__x);
    }
    else {
      (**(code **)(*(long *)cVar2._M_node[1]._M_parent + 0x10))
                (cVar2._M_node[1]._M_parent,local_40,(long)&(pTVar1->data)._M_dataplus._M_p + lVar3)
      ;
    }
    if (__x->type == Positional) {
      position = position + 1;
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x28;
  }
  return local_48;
}

Assistant:

std::vector<Parser::Token> populateFixedArgs( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            int position = 1;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::map<int, Arg>::const_iterator it = m_positionalArgs.find( position );
                if( it != m_positionalArgs.end() )
                    it->second.boundField.set( config, token.data );
                else
                    unusedTokens.push_back( token );
                if( token.type == Parser::Token::Positional )
                    position++;
            }
            return unusedTokens;
        }